

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::exception(string *message)

{
  ostream *poVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 options::printPrefix_abi_cxx11_," [EXCEPTION] ");
  std::operator+(&local_30,&local_50,message);
  std::__cxx11::string::operator=((string *)message,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)message);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)message);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void exception(std::string message) {

  message = options::printPrefix + " [EXCEPTION] " + message;

  if (options::verbosity > 0) {
    std::cout << message << std::endl;
  }

  throw std::runtime_error(message);
}